

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  FieldDescriptor *pFVar6;
  ulong uVar7;
  byte *pbVar8;
  Reflection *this;
  ulong uVar9;
  uint32_t field_number;
  uint size;
  string message_data;
  byte *local_a0;
  long local_98;
  byte local_90 [16];
  CodedInputStream local_80;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  local_98 = 0;
  local_90[0] = 0;
  uVar7 = 0;
  local_a0 = local_90;
LAB_003bb360:
  do {
    pbVar8 = input->buffer_;
    if (pbVar8 < input->buffer_end_) {
      uVar4 = (uint32_t)*pbVar8;
      if ((char)*pbVar8 < '\0') goto LAB_003bb37a;
      input->buffer_ = pbVar8 + 1;
    }
    else {
      uVar4 = 0;
LAB_003bb37a:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    }
    field_number = (uint32_t)uVar7;
    if ((int)uVar4 < 0x1a) {
      if (uVar4 != 0) {
        if (uVar4 == 0xc) {
          uVar7 = 1;
          goto LAB_003bb588;
        }
        if (uVar4 != 0x10) goto LAB_003bb3c4;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (ulong)bVar1;
          uVar4 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003bb418;
          input->buffer_ = pbVar8 + 1;
        }
        else {
          uVar4 = 0;
LAB_003bb418:
          uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          if ((long)uVar7 < 0) goto LAB_003bb586;
        }
        if (local_98 == 0) goto LAB_003bb360;
        local_80.buffer_ = local_a0;
        local_80.total_bytes_read_ = (int)local_98;
        local_80.buffer_end_ = local_a0 + local_80.total_bytes_read_;
        local_80.input_ = (ZeroCopyInputStream *)0x0;
        local_80.overflow_bytes_ = 0;
        local_80.last_tag_ = 0;
        local_80.legitimate_message_end_ = false;
        local_80.aliasing_enabled_ = false;
        local_80.buffer_size_after_limit_ = 0;
        local_80.total_bytes_limit_ = 0x7fffffff;
        local_80.extension_pool_ = (DescriptorPool *)0x0;
        local_80.extension_factory_ = (MessageFactory *)0x0;
        local_80.recursion_budget_ = input->recursion_budget_;
        local_80.current_limit_ = local_80.total_bytes_read_;
        local_80.recursion_limit_ = local_80.recursion_budget_;
        pFVar6 = Reflection::FindKnownExtensionByNumber(this,(uint32_t)uVar7);
        bVar3 = ParseAndMergeMessageSetField((uint32_t)uVar7,pFVar6,message,&local_80);
        if (bVar3) {
          local_98 = 0;
          *local_a0 = 0;
          io::CodedInputStream::~CodedInputStream(&local_80);
          goto LAB_003bb360;
        }
        io::CodedInputStream::~CodedInputStream(&local_80);
      }
LAB_003bb586:
      uVar7 = 0;
      goto LAB_003bb588;
    }
    if (uVar4 == 0x1a) {
      if (field_number != 0) {
        pFVar6 = Reflection::FindKnownExtensionByNumber(this,field_number);
        bVar3 = ParseAndMergeMessageSetField(field_number,pFVar6,message,input);
        goto LAB_003bb3d0;
      }
      pbVar8 = input->buffer_;
      if (pbVar8 < input->buffer_end_) {
        bVar1 = *pbVar8;
        uVar7 = (ulong)bVar1;
        uVar4 = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003bb4d5;
        input->buffer_ = pbVar8 + 1;
      }
      else {
        uVar4 = 0;
LAB_003bb4d5:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        if ((uVar7 & 0x8000000080000000) != 0) goto LAB_003bb586;
      }
      size = (uint)uVar7;
      iVar2 = 0x1f;
      if ((size | 1) != 0) {
        for (; (size | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar1 = (byte)uVar7;
      std::__cxx11::string::resize((ulong)&local_a0,(char)(iVar2 * 9 + 0x49U >> 6) + bVar1);
      *local_a0 = bVar1;
      if (size < 0x80) {
        pbVar8 = local_a0 + 1;
      }
      else {
        *local_a0 = bVar1 | 0x80;
        uVar7 = uVar7 >> 7 & 0x1ffffff;
        local_a0[1] = (byte)uVar7;
        pbVar8 = local_a0 + 2;
        if (0x3fff < size) {
          uVar9 = (ulong)local_a0[1];
          do {
            pbVar8[-1] = (byte)uVar9 | 0x80;
            uVar9 = uVar7 >> 7;
            *pbVar8 = (byte)uVar9;
            pbVar8 = pbVar8 + 1;
            uVar5 = (uint)uVar7;
            uVar7 = uVar9;
          } while (0x3fff < uVar5);
        }
      }
      bVar3 = io::CodedInputStream::ReadRaw(input,pbVar8,size);
      uVar7 = 0;
      if (!bVar3) {
LAB_003bb588:
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
        return SUB81(uVar7,0);
      }
    }
    else {
LAB_003bb3c4:
      bVar3 = SkipField(input,uVar4,(UnknownFieldSet *)0x0);
LAB_003bb3d0:
      if (bVar3 == false) goto LAB_003bb586;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}